

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::Swap(Reflection *this,Message *message1,Message *message2)

{
  ReflectionSchema *pRVar1;
  undefined4 uVar2;
  long lVar3;
  pointer pUVar4;
  pointer pUVar5;
  pointer pUVar6;
  pointer pUVar7;
  int iVar8;
  uint32 uVar9;
  uint32 uVar10;
  LogMessage *pLVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar12;
  Message *message2_00;
  UnknownFieldSet *pUVar13;
  ulong uVar14;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  ulong uVar15;
  long lVar16;
  long lVar17;
  UnknownFieldSet *pUVar18;
  long lVar19;
  LogMessage local_78;
  ReflectionSchema *local_40;
  LogFinisher local_31;
  undefined4 extraout_var_01;
  
  if (message1 != message2) {
    (*(message1->super_MessageLite)._vptr_MessageLite[0x13])(message1);
    if (extraout_RDX != this) {
      internal::LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x255);
      pLVar11 = internal::LogMessage::operator<<
                          (&local_78,"CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar11 = internal::LogMessage::operator<<(pLVar11,"First argument to Swap() (of type \"");
      iVar8 = (*(message1->super_MessageLite)._vptr_MessageLite[0x13])(message1);
      pLVar11 = internal::LogMessage::operator<<
                          (pLVar11,*(string **)(CONCAT44(extraout_var,iVar8) + 8));
      pLVar11 = internal::LogMessage::operator<<
                          (pLVar11,
                           "\") is not compatible with this reflection object (which is for type \""
                          );
      pLVar11 = internal::LogMessage::operator<<(pLVar11,*(string **)(this->descriptor_ + 8));
      pLVar11 = internal::LogMessage::operator<<
                          (pLVar11,
                           "\").  Note that the exact same class is required; not just the same descriptor."
                          );
      internal::LogFinisher::operator=(&local_31,pLVar11);
      internal::LogMessage::~LogMessage(&local_78);
    }
    (*(message2->super_MessageLite)._vptr_MessageLite[0x13])(message2);
    if (extraout_RDX_00 != this) {
      internal::LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x25d);
      pLVar11 = internal::LogMessage::operator<<
                          (&local_78,"CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar11 = internal::LogMessage::operator<<(pLVar11,"Second argument to Swap() (of type \"");
      iVar8 = (*(message2->super_MessageLite)._vptr_MessageLite[0x13])(message2);
      pLVar11 = internal::LogMessage::operator<<
                          (pLVar11,*(string **)(CONCAT44(extraout_var_00,iVar8) + 8));
      pLVar11 = internal::LogMessage::operator<<
                          (pLVar11,
                           "\") is not compatible with this reflection object (which is for type \""
                          );
      pLVar11 = internal::LogMessage::operator<<(pLVar11,*(string **)(this->descriptor_ + 8));
      pLVar11 = internal::LogMessage::operator<<
                          (pLVar11,
                           "\").  Note that the exact same class is required; not just the same descriptor."
                          );
      internal::LogFinisher::operator=(&local_31,pLVar11);
      internal::LogMessage::~LogMessage(&local_78);
    }
    uVar14 = (ulong)(uint)(this->schema_).metadata_offset_;
    uVar15 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar14);
    uVar12 = uVar15;
    if ((uVar15 & 1) != 0) {
      uVar12 = *(ulong *)(uVar15 & 0xfffffffffffffffe);
    }
    uVar14 = *(ulong *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar14);
    if ((uVar14 & 1) != 0) {
      uVar14 = *(ulong *)(uVar14 & 0xfffffffffffffffe);
    }
    if (uVar12 == uVar14) {
      pRVar1 = &this->schema_;
      if ((this->schema_).has_bits_offset_ != -1) {
        uVar9 = internal::ReflectionSchema::HasBitsOffset(pRVar1);
        if ((this->schema_).has_bits_offset_ == -1) {
          internal::LogMessage::LogMessage
                    (&local_78,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/generated_message_reflection.cc"
                     ,0x75b);
          pLVar11 = internal::LogMessage::operator<<
                              (&local_78,"CHECK failed: schema_.HasHasbits(): ");
          internal::LogFinisher::operator=(&local_31,pLVar11);
          internal::LogMessage::~LogMessage(&local_78);
        }
        uVar10 = internal::ReflectionSchema::HasBitsOffset(pRVar1);
        lVar16 = (long)*(int *)(this->descriptor_ + 0x68);
        if (0 < lVar16) {
          lVar19 = *(long *)(this->descriptor_ + 0x28);
          lVar17 = 0;
          iVar8 = 0;
          do {
            if ((*(int *)(lVar19 + 0x3c + lVar17) != 3) &&
               ((lVar3 = *(long *)(lVar19 + 0x58 + lVar17), lVar3 == 0 ||
                ((*(int *)(lVar3 + 0x18) == 1 &&
                 (*(char *)(**(long **)(lVar3 + 0x20) + 0x41) != '\0')))))) {
              iVar8 = iVar8 + 1;
            }
            lVar17 = lVar17 + 0x98;
          } while (lVar16 * 0x98 - lVar17 != 0);
          if (0 < iVar8) {
            uVar15 = 0;
            do {
              uVar2 = *(undefined4 *)
                       ((long)&(message1->super_MessageLite)._vptr_MessageLite +
                       uVar15 * 4 + (ulong)uVar9);
              *(undefined4 *)
               ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar15 * 4 + (ulong)uVar9)
                   = *(undefined4 *)
                      ((long)&(message2->super_MessageLite)._vptr_MessageLite +
                      uVar15 * 4 + (ulong)uVar10);
              *(undefined4 *)
               ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar15 * 4 + (ulong)uVar10)
                   = uVar2;
              uVar15 = uVar15 + 1;
            } while (iVar8 + 0x1fU >> 5 != uVar15);
          }
        }
      }
      iVar8 = this->last_non_weak_field_index_;
      local_40 = pRVar1;
      if (-1 < iVar8) {
        lVar19 = -1;
        lVar16 = 0;
        do {
          lVar17 = *(long *)(*(long *)(this->descriptor_ + 0x28) + 0x58 + lVar16);
          if ((lVar17 == 0) ||
             ((*(int *)(lVar17 + 0x18) == 1 &&
              (*(char *)(**(long **)(lVar17 + 0x20) + 0x41) == '\x01')))) {
            SwapField(this,message1,message2,
                      (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x28) + lVar16));
            iVar8 = this->last_non_weak_field_index_;
          }
          lVar19 = lVar19 + 1;
          lVar16 = lVar16 + 0x98;
        } while (lVar19 < iVar8);
      }
      iVar8 = *(int *)(this->descriptor_ + 0x6c);
      if (0 < (long)iVar8) {
        lVar16 = 0;
        do {
          lVar19 = *(long *)(this->descriptor_ + 0x30);
          if ((*(int *)(lVar19 + 0x18 + lVar16) != 1) ||
             (*(char *)(**(long **)(lVar19 + 0x20 + lVar16) + 0x41) == '\0')) {
            SwapOneofField(this,message1,message2,(OneofDescriptor *)(lVar19 + lVar16));
          }
          lVar16 = lVar16 + 0x30;
        } while ((long)iVar8 * 0x30 != lVar16);
      }
      pRVar1 = local_40;
      if ((this->schema_).extensions_offset_ != -1) {
        uVar9 = internal::ReflectionSchema::GetExtensionSetOffset(local_40);
        uVar10 = internal::ReflectionSchema::GetExtensionSetOffset(pRVar1);
        internal::ExtensionSet::Swap
                  ((ExtensionSet *)
                   ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9),
                   (ExtensionSet *)
                   ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10));
      }
      uVar12 = (ulong)(uint)(this->schema_).metadata_offset_;
      uVar15 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar12);
      if ((uVar15 & 1) == 0) {
        pUVar18 = internal::InternalMetadata::
                  mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                            ((InternalMetadata *)
                             ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar12));
        uVar12 = (ulong)(uint)(this->schema_).metadata_offset_;
      }
      else {
        pUVar18 = (UnknownFieldSet *)((uVar15 & 0xfffffffffffffffe) + 8);
      }
      uVar15 = *(ulong *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar12);
      if ((uVar15 & 1) == 0) {
        pUVar13 = internal::InternalMetadata::
                  mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                            ((InternalMetadata *)
                             ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar12));
      }
      else {
        pUVar13 = (UnknownFieldSet *)((uVar15 & 0xfffffffffffffffe) + 8);
      }
      pUVar4 = (pUVar18->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pUVar5 = (pUVar13->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pUVar6 = (pUVar18->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pUVar7 = (pUVar18->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (pUVar18->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pUVar13->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pUVar18->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish = pUVar5;
      (pUVar18->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pUVar13->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pUVar13->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start = pUVar6;
      (pUVar13->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish = pUVar7;
      (pUVar13->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pUVar4;
    }
    else {
      if ((uVar15 & 1) != 0) {
        uVar15 = *(ulong *)(uVar15 & 0xfffffffffffffffe);
      }
      iVar8 = (*(message1->super_MessageLite)._vptr_MessageLite[4])(message1,uVar15);
      message2_00 = (Message *)CONCAT44(extraout_var_01,iVar8);
      (*(message2_00->super_MessageLite)._vptr_MessageLite[0xf])(message2_00,message2);
      (*(message2->super_MessageLite)._vptr_MessageLite[0xe])(message2,message1);
      Swap(this,message1,message2_00);
      uVar15 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                         (ulong)(uint)(this->schema_).metadata_offset_);
      if ((uVar15 & 1) != 0) {
        uVar15 = *(ulong *)(uVar15 & 0xfffffffffffffffe);
      }
      if (uVar15 == 0) {
        (*(message2_00->super_MessageLite)._vptr_MessageLite[1])(message2_00);
      }
    }
  }
  return;
}

Assistant:

void Reflection::Swap(Message* message1, Message* message2) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
      << "First argument to Swap() (of type \""
      << message1->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
      << "Second argument to Swap() (of type \""
      << message2->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  // Check that both messages are in the same arena (or both on the heap). We
  // need to copy all data if not, due to ownership semantics.
  if (GetArena(message1) != GetArena(message2)) {
    // Slow copy path.
    // Use our arena as temp space, if available.
    Message* temp = message1->New(GetArena(message1));
    temp->MergeFrom(*message2);
    message2->CopyFrom(*message1);
    Swap(message1, temp);
    if (GetArena(message1) == nullptr) {
      delete temp;
    }
    return;
  }

  if (schema_.HasHasbits()) {
    uint32* has_bits1 = MutableHasBits(message1);
    uint32* has_bits2 = MutableHasBits(message2);

    int fields_with_has_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->is_repeated() || schema_.InRealOneof(field)) {
        continue;
      }
      fields_with_has_bits++;
    }

    int has_bits_size = (fields_with_has_bits + 31) / 32;

    for (int i = 0; i < has_bits_size; i++) {
      std::swap(has_bits1[i], has_bits2[i]);
    }
  }

  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (schema_.InRealOneof(field)) continue;
    SwapField(message1, message2, field);
  }
  const int oneof_decl_count = descriptor_->oneof_decl_count();
  for (int i = 0; i < oneof_decl_count; i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    if (!oneof->is_synthetic()) {
      SwapOneofField(message1, message2, oneof);
    }
  }

  if (schema_.HasExtensionSet()) {
    MutableExtensionSet(message1)->Swap(MutableExtensionSet(message2));
  }

  MutableUnknownFields(message1)->Swap(MutableUnknownFields(message2));
}